

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_v6addr_is_local_(in6_addr *in)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (((*(long *)&in->__in6_u != 0) && (bVar1 = (in->__in6_u).__u6_addr8[0], (bVar1 & 0xfe) != 0xfc)
      ) && ((bVar1 != 0xfe || ((in->__in6_u).__u6_addr8[1] < 0xc0)))) {
    uVar2 = (uint)(bVar1 == 0xff);
  }
  return uVar2;
}

Assistant:

int
evutil_v6addr_is_local_(const struct in6_addr *in)
{
	static const char ZEROES[] =
		"\x00\x00\x00\x00\x00\x00\x00\x00"
		"\x00\x00\x00\x00\x00\x00\x00\x00";

	const unsigned char *addr = (const unsigned char *)in->s6_addr;
	return !memcmp(addr, ZEROES, 8) ||
		((addr[0] & 0xfe) == 0xfc) ||
		(addr[0] == 0xfe && (addr[1] & 0xc0) == 0x80) ||
		(addr[0] == 0xfe && (addr[1] & 0xc0) == 0xc0) ||
		(addr[0] == 0xff);
}